

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O1

void __thiscall ThreadedImageSaver::runThread(ThreadedImageSaver *this)

{
  pointer ppVar1;
  char *__end;
  pair<Image,_std::filesystem::__cxx11::path> *__p;
  unique_lock<std::mutex> l;
  string local_b0;
  unique_lock *local_90;
  unique_lock<std::mutex> local_88;
  Image local_78;
  path local_58;
  
  local_88._M_device = &this->mtx;
  local_88._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_88);
  local_88._M_owns = true;
  if (this->stopped == false) {
    local_90 = (unique_lock *)&this->cv;
    do {
      std::condition_variable::wait(local_90);
      while (ppVar1 = (this->images).
                      super__Vector_base<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            (this->images).
            super__Vector_base<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
            ._M_impl.super__Vector_impl_data._M_start != ppVar1) {
        local_78.size = ppVar1[-1].first.size;
        local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
        super__Vector_impl_data._M_start =
             ppVar1[-1].first.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
        super__Vector_impl_data._M_finish =
             ppVar1[-1].first.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             ppVar1[-1].first.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        ppVar1[-1].first.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ppVar1[-1].first.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ppVar1[-1].first.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::filesystem::__cxx11::path::path(&local_58,&ppVar1[-1].second);
        __p = (this->images).
              super__Vector_base<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
        (this->images).
        super__Vector_base<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = __p;
        __gnu_cxx::new_allocator<std::pair<Image,std::filesystem::__cxx11::path>>::
        destroy<std::pair<Image,std::filesystem::__cxx11::path>>
                  ((new_allocator<std::pair<Image,std::filesystem::__cxx11::path>> *)&this->images,
                   __p);
        std::unique_lock<std::mutex>::unlock(&local_88);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
        Image::writePNG(&local_78,&local_58,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        std::unique_lock<std::mutex>::lock(&local_88);
        std::filesystem::__cxx11::path::~path(&local_58);
        if (local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
    } while (this->stopped == false);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_88);
  return;
}

Assistant:

void ThreadedImageSaver::runThread() {
	std::unique_lock<std::mutex> l(mtx);
	while (!stopped) {
		cv.wait(l);
		while (!images.empty()) {
			auto img = std::move(images.back());
			images.pop_back();
			l.unlock();
			img.first.writePNG(img.second);
			l.lock();
		}
	}
}